

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall wasm::PassRunner::add(PassRunner *this,string *passName)

{
  undefined8 uVar1;
  string local_50 [32];
  long *local_30;
  
  uVar1 = ::wasm::PassRegistry::get();
  std::__cxx11::string::string(local_50,(string *)passName);
  ::wasm::PassRegistry::createPass(&local_30,uVar1,local_50);
  (**(code **)(*(long *)this + 0x10))(this,&local_30);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  local_30 = (long *)0x0;
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void add(std::string passName) {
    doAdd(PassRegistry::get()->createPass(passName));
  }